

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Interpolation v)

{
  Interpolation in_EDX;
  string local_38;
  Interpolation local_14;
  ostream *poStack_10;
  Interpolation v_local;
  ostream *ofs_local;
  
  local_14 = v;
  poStack_10 = ofs;
  tinyusdz::to_string_abi_cxx11_(&local_38,(tinyusdz *)(ulong)v,in_EDX);
  std::operator<<(ofs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poStack_10;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Interpolation v) {
  ofs << to_string(v);

  return ofs;
}